

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFloat(Parser *this,ai_real *fOut)

{
  char *pcVar1;
  undefined1 in_CL;
  Assimp *this_00;
  
  for (this_00 = (Assimp *)this->filePtr; (*this_00 == (Assimp)0x20 || (*this_00 == (Assimp)0x9));
      this_00 = this_00 + 1) {
  }
  this->filePtr = (char *)this_00;
  if (((byte)*this_00 < 0xe) && (in_CL = true, (0x3401U >> ((byte)*this_00 & 0x1f) & 1) != 0)) {
    LogWarning(this,"Unable to parse float: unexpected EOL [#1]");
    *fOut = 0.0;
    this->iLineNumber = this->iLineNumber + 1;
  }
  else {
    pcVar1 = fast_atoreal_move<float>(this_00,(char *)fOut,(float *)0x1,(bool)in_CL);
    this->filePtr = pcVar1;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFloat(ai_real& fOut)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        // LOG
        LogWarning("Unable to parse float: unexpected EOL [#1]");
        fOut = 0.0;
        ++iLineNumber;
        return;
    }
    // parse the first float
    filePtr = fast_atoreal_move<ai_real>(filePtr,fOut);
}